

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

int trans_cmp_fn(ScanStateTransition *a,ScanStateTransition *b,hash_fns_t *fns)

{
  Action **ppAVar1;
  Action **ppAVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (fns->data[0] == (void *)0x0) {
    uVar3 = (a->live_diff).n;
    if ((uVar3 == (b->live_diff).n) && (uVar4 = (a->accepts_diff).n, uVar4 == (b->accepts_diff).n))
    {
      uVar5 = 0;
      do {
        if (uVar3 == uVar5) goto LAB_0013fcb0;
        ppAVar1 = (a->live_diff).v + uVar5;
        ppAVar2 = (b->live_diff).v + uVar5;
        uVar5 = uVar5 + 1;
      } while (*ppAVar1 == *ppAVar2);
    }
  }
  else {
    uVar4 = (a->accepts_diff).n;
    if (uVar4 == (b->accepts_diff).n) {
LAB_0013fcb0:
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          return 0;
        }
        ppAVar1 = (a->accepts_diff).v + uVar5;
        ppAVar2 = (b->accepts_diff).v + uVar5;
        uVar5 = uVar5 + 1;
      } while (*ppAVar1 == *ppAVar2);
    }
  }
  return 1;
}

Assistant:

static int trans_cmp_fn(ScanStateTransition *a, ScanStateTransition *b, hash_fns_t *fns) {
  uint i;

  if (!fns->data[0])
    if (a->live_diff.n != b->live_diff.n) return 1;
  if (a->accepts_diff.n != b->accepts_diff.n) return 1;
  if (!fns->data[0])
    for (i = 0; i < a->live_diff.n; i++)
      if (a->live_diff.v[i] != b->live_diff.v[i]) return 1;
  for (i = 0; i < a->accepts_diff.n; i++)
    if (a->accepts_diff.v[i] != b->accepts_diff.v[i]) return 1;
  return 0;
}